

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O3

bool __thiscall
irr::scene::CAnimatedMeshSceneNode::setFrameLoop(CAnimatedMeshSceneNode *this,s32 begin,s32 end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (*(this->Mesh->super_IMesh)._vptr_IMesh[10])();
  iVar2 = iVar2 + -1;
  iVar1 = begin;
  if (end < begin) {
    iVar1 = end;
  }
  if (begin < end) {
    begin = end;
  }
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  if (iVar2 <= iVar3) {
    iVar3 = iVar2;
  }
  if (begin <= iVar3) {
    begin = iVar3;
  }
  if (iVar2 <= begin) {
    begin = iVar2;
  }
  this->StartFrame = iVar3;
  this->EndFrame = begin;
  if (0.0 < (float)this->FramesPerSecond || (float)this->FramesPerSecond == 0.0) {
    begin = iVar3;
  }
  (**(code **)(*(long *)this + 0x120))((float)begin,this);
  return true;
}

Assistant:

bool CAnimatedMeshSceneNode::setFrameLoop(s32 begin, s32 end)
{
	const s32 maxFrameCount = Mesh->getFrameCount() - 1;
	if (end < begin) {
		StartFrame = core::s32_clamp(end, 0, maxFrameCount);
		EndFrame = core::s32_clamp(begin, StartFrame, maxFrameCount);
	} else {
		StartFrame = core::s32_clamp(begin, 0, maxFrameCount);
		EndFrame = core::s32_clamp(end, StartFrame, maxFrameCount);
	}
	if (FramesPerSecond < 0)
		setCurrentFrame((f32)EndFrame);
	else
		setCurrentFrame((f32)StartFrame);

	return true;
}